

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softmax.cpp
# Opt level: O0

int __thiscall ncnn::Softmax::forward_inplace(Softmax *this,Mat *bottom_top_blob,Option *opt)

{
  bool bVar1;
  float *pfVar2;
  Mat *in_RSI;
  long in_RDI;
  double dVar3;
  int j_15;
  int i_23;
  float *sumptr_3;
  float *ptr_20;
  int q_11;
  int j_14;
  int i_22;
  float *sumptr_2;
  float *ptr_19;
  int q_10;
  Mat sum_7;
  int j_13;
  int i_21;
  float *maxptr_3;
  float *ptr_18;
  int q_9;
  int j_12;
  int i_20;
  float *maxptr_2;
  float *ptr_17;
  int q_8;
  Mat max_7;
  int channels_2;
  int h_4;
  int w_5;
  int j_11;
  float sum_6;
  int i_19;
  float *sumptr_1;
  float *ptr_16;
  int q_7;
  int j_10;
  float sum_5;
  int i_18;
  float *sumptr;
  float *ptr_15;
  int q_6;
  Mat sum_4;
  int j_9;
  float max_6;
  int i_17;
  float *maxptr_1;
  float *ptr_14;
  int q_5;
  int j_8;
  float max_5;
  int i_16;
  float *maxptr;
  float *ptr_13;
  int q_4;
  Mat max_4;
  int channels_1;
  int h_3;
  int w_4;
  int i_15;
  float *ptr_12;
  int q_3;
  int i_14;
  float *ptr_11;
  int q_2;
  Mat sum_3;
  int i_13;
  float *ptr_10;
  int q_1;
  int i_12;
  float *ptr_9;
  int q;
  Mat max_3;
  int size;
  int channels;
  int h_2;
  int w_3;
  int j_7;
  float s_1;
  float *ptr_8;
  int i_11;
  int j_6;
  float s;
  float *ptr_7;
  int i_10;
  Mat sum_2;
  int j_5;
  float m_1;
  float *ptr_6;
  int i_9;
  int j_4;
  float m;
  float *ptr_5;
  int i_8;
  Mat max_2;
  int h_1;
  int w_2;
  int j_3;
  float *ptr_4;
  int i_7;
  int j_2;
  float *ptr_3;
  int i_6;
  Mat sum_1;
  int j_1;
  float *ptr_2;
  int i_5;
  int j;
  float *ptr_1;
  int i_4;
  Mat max_1;
  int h;
  int w_1;
  int i_3;
  int i_2;
  float sum;
  int i_1;
  int i;
  float max;
  float *ptr;
  int w;
  size_t elemsize;
  int dims;
  Mat *in_stack_fffffffffffff650;
  Mat *in_stack_fffffffffffff658;
  float fVar4;
  Mat *in_stack_fffffffffffff660;
  undefined8 in_stack_fffffffffffff668;
  int iVar5;
  undefined4 in_stack_fffffffffffff670;
  float in_stack_fffffffffffff674;
  int local_778;
  int local_774;
  Mat local_768;
  Mat *local_730;
  int local_724;
  int local_720;
  int local_71c;
  float *local_718;
  Mat local_710;
  float *local_6d8;
  int local_6cc;
  Mat local_6c8;
  int local_690;
  int local_68c;
  float *local_688;
  Mat local_680;
  float *local_648;
  int local_63c;
  int local_638;
  int local_634;
  float *local_630;
  Mat local_628;
  float *local_5f0;
  int local_5e4;
  Mat local_5e0;
  int local_5a8;
  int local_5a4;
  int local_5a0;
  int local_59c;
  float local_598;
  int local_594;
  float *local_590;
  Mat local_588;
  float *local_550;
  int local_548;
  int local_544;
  float local_540;
  int local_53c;
  float *local_538;
  Mat local_530;
  float *local_4f8;
  int local_4ec;
  Mat local_4e8;
  int local_4ac;
  float local_4a8;
  int local_4a4;
  float *local_4a0;
  Mat local_498;
  float *local_460;
  int local_458;
  int local_454;
  float local_450;
  int local_44c;
  float *local_448;
  Mat local_440;
  float *local_408;
  int local_3fc;
  Mat local_3f8;
  int local_3c0;
  int local_3bc;
  int local_3b8;
  int local_3b4;
  Mat local_3b0;
  float *local_378;
  int local_370;
  int local_36c;
  Mat local_368;
  float *local_330;
  int local_324;
  Mat local_320;
  int local_2e4;
  Mat local_2e0;
  float *local_2a8;
  int local_2a0;
  int local_29c;
  Mat local_298;
  float *local_260;
  int local_254;
  Mat local_250;
  int local_218;
  int local_214;
  int local_210;
  int local_20c;
  int local_208;
  float local_204;
  float *local_200;
  int local_1f4;
  int local_1f0;
  float local_1ec;
  float *local_1e8;
  int local_1dc;
  Mat local_1d8;
  int local_1a0;
  float local_19c;
  float *local_198;
  int local_18c;
  int local_188;
  float local_184;
  float *local_180;
  int local_174;
  Mat local_170;
  int local_134;
  int local_130;
  int local_12c;
  float *local_128;
  int local_120;
  int local_11c;
  float *local_118;
  int local_10c;
  Mat local_108;
  int local_cc;
  float *local_c8;
  int local_c0;
  int local_bc;
  float *local_b8;
  int local_ac;
  undefined4 local_a8;
  Mat local_98;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  float local_50;
  int local_4c;
  int local_48;
  float local_44;
  float *local_40;
  int local_34;
  size_t local_30;
  int local_24;
  Mat *local_18;
  int local_4;
  
  local_24 = in_RSI->dims;
  local_30 = in_RSI->elemsize;
  if (local_24 == 1) {
    local_34 = in_RSI->w;
    local_40 = Mat::operator_cast_to_float_(in_RSI);
    local_44 = -3.4028235e+38;
    for (local_48 = 0; local_48 < local_34; local_48 = local_48 + 1) {
      pfVar2 = std::max<float>(&local_44,local_40 + local_48);
      local_44 = *pfVar2;
    }
    for (local_4c = 0; local_4c < local_34; local_4c = local_4c + 1) {
      dVar3 = std::exp((double)(ulong)(uint)(local_40[local_4c] - local_44));
      local_40[local_4c] = SUB84(dVar3,0);
    }
    local_50 = 0.0;
    for (local_54 = 0; local_54 < local_34; local_54 = local_54 + 1) {
      local_50 = local_40[local_54] + local_50;
    }
    for (local_58 = 0; local_58 < local_34; local_58 = local_58 + 1) {
      local_40[local_58] = local_40[local_58] / local_50;
    }
    local_4 = 0;
  }
  else {
    local_18 = in_RSI;
    if ((local_24 == 2) && (*(int *)(in_RDI + 0x80) == 0)) {
      local_5c = in_RSI->w;
      local_60 = in_RSI->h;
      Mat::Mat(&local_98);
      Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
                  (int)((ulong)in_stack_fffffffffffff668 >> 0x20),(size_t)in_stack_fffffffffffff660,
                  (Allocator *)in_stack_fffffffffffff658);
      bVar1 = Mat::empty(in_stack_fffffffffffff650);
      if (bVar1) {
        local_4 = -100;
        local_a8 = 1;
      }
      else {
        Mat::fill(in_stack_fffffffffffff660,(float)((ulong)in_stack_fffffffffffff658 >> 0x20));
        for (local_ac = 0; local_ac < local_60; local_ac = local_ac + 1) {
          local_b8 = Mat::row(local_18,local_ac);
          for (local_bc = 0; local_bc < local_5c; local_bc = local_bc + 1) {
            pfVar2 = Mat::operator[](&local_98,local_bc);
            pfVar2 = std::max<float>(pfVar2,local_b8 + local_bc);
            fVar4 = *pfVar2;
            pfVar2 = Mat::operator[](&local_98,local_bc);
            *pfVar2 = fVar4;
          }
        }
        for (local_c0 = 0; iVar5 = (int)((ulong)in_stack_fffffffffffff668 >> 0x20),
            local_c0 < local_60; local_c0 = local_c0 + 1) {
          local_c8 = Mat::row(local_18,local_c0);
          for (local_cc = 0; local_cc < local_5c; local_cc = local_cc + 1) {
            fVar4 = local_c8[local_cc];
            pfVar2 = Mat::operator[](&local_98,local_cc);
            dVar3 = std::exp((double)(ulong)(uint)(fVar4 - *pfVar2));
            local_c8[local_cc] = SUB84(dVar3,0);
          }
        }
        Mat::Mat(&local_108);
        Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),iVar5,
                    (size_t)in_stack_fffffffffffff660,(Allocator *)in_stack_fffffffffffff658);
        fVar4 = (float)((ulong)in_stack_fffffffffffff658 >> 0x20);
        bVar1 = Mat::empty(in_stack_fffffffffffff650);
        if (bVar1) {
          local_4 = -100;
        }
        else {
          Mat::fill(in_stack_fffffffffffff660,fVar4);
          for (local_10c = 0; local_10c < local_60; local_10c = local_10c + 1) {
            local_118 = Mat::row(local_18,local_10c);
            for (local_11c = 0; local_11c < local_5c; local_11c = local_11c + 1) {
              fVar4 = local_118[local_11c];
              pfVar2 = Mat::operator[](&local_108,local_11c);
              *pfVar2 = fVar4 + *pfVar2;
            }
          }
          for (local_120 = 0; local_120 < local_60; local_120 = local_120 + 1) {
            local_128 = Mat::row(local_18,local_120);
            for (local_12c = 0; local_12c < local_5c; local_12c = local_12c + 1) {
              pfVar2 = Mat::operator[](&local_108,local_12c);
              local_128[local_12c] = local_128[local_12c] / *pfVar2;
            }
          }
          local_4 = 0;
        }
        local_a8 = 1;
        Mat::~Mat((Mat *)0x131d8d);
      }
      Mat::~Mat((Mat *)0x131d9a);
    }
    else if ((local_24 == 2) && (*(int *)(in_RDI + 0x80) == 1)) {
      local_130 = in_RSI->w;
      local_134 = in_RSI->h;
      Mat::Mat(&local_170);
      Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
                  (int)((ulong)in_stack_fffffffffffff668 >> 0x20),(size_t)in_stack_fffffffffffff660,
                  (Allocator *)in_stack_fffffffffffff658);
      bVar1 = Mat::empty(in_stack_fffffffffffff650);
      if (bVar1) {
        local_4 = -100;
        local_a8 = 1;
      }
      else {
        for (local_174 = 0; local_174 < local_134; local_174 = local_174 + 1) {
          local_180 = Mat::row(local_18,local_174);
          local_184 = -3.4028235e+38;
          for (local_188 = 0; fVar4 = local_184, local_188 < local_130; local_188 = local_188 + 1) {
            pfVar2 = std::max<float>(&local_184,local_180 + local_188);
            local_184 = *pfVar2;
          }
          pfVar2 = Mat::operator[](&local_170,local_174);
          *pfVar2 = fVar4;
        }
        for (local_18c = 0; iVar5 = (int)((ulong)in_stack_fffffffffffff668 >> 0x20),
            local_18c < local_134; local_18c = local_18c + 1) {
          local_198 = Mat::row(local_18,local_18c);
          pfVar2 = Mat::operator[](&local_170,local_18c);
          local_19c = *pfVar2;
          for (local_1a0 = 0; local_1a0 < local_130; local_1a0 = local_1a0 + 1) {
            dVar3 = std::exp((double)(ulong)(uint)(local_198[local_1a0] - local_19c));
            local_198[local_1a0] = SUB84(dVar3,0);
          }
        }
        Mat::Mat(&local_1d8);
        Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),iVar5,
                    (size_t)in_stack_fffffffffffff660,(Allocator *)in_stack_fffffffffffff658);
        bVar1 = Mat::empty(in_stack_fffffffffffff650);
        if (bVar1) {
          local_4 = -100;
        }
        else {
          for (local_1dc = 0; local_1dc < local_134; local_1dc = local_1dc + 1) {
            local_1e8 = Mat::row(local_18,local_1dc);
            local_1ec = 0.0;
            for (local_1f0 = 0; fVar4 = local_1ec, local_1f0 < local_130; local_1f0 = local_1f0 + 1)
            {
              local_1ec = local_1e8[local_1f0] + local_1ec;
            }
            pfVar2 = Mat::operator[](&local_1d8,local_1dc);
            *pfVar2 = fVar4;
          }
          for (local_1f4 = 0; local_1f4 < local_134; local_1f4 = local_1f4 + 1) {
            local_200 = Mat::row(local_18,local_1f4);
            pfVar2 = Mat::operator[](&local_1d8,local_1f4);
            local_204 = *pfVar2;
            for (local_208 = 0; local_208 < local_130; local_208 = local_208 + 1) {
              local_200[local_208] = local_200[local_208] / local_204;
            }
          }
          local_4 = 0;
        }
        local_a8 = 1;
        Mat::~Mat((Mat *)0x132381);
      }
      Mat::~Mat((Mat *)0x13238e);
    }
    else if ((local_24 == 3) && (*(int *)(in_RDI + 0x80) == 0)) {
      local_20c = in_RSI->w;
      local_210 = in_RSI->h;
      local_214 = in_RSI->c;
      local_218 = local_20c * local_210;
      Mat::Mat(&local_250);
      Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
                  (int)((ulong)in_stack_fffffffffffff668 >> 0x20),(int)in_stack_fffffffffffff668,
                  (size_t)in_stack_fffffffffffff660,(Allocator *)in_stack_fffffffffffff658);
      bVar1 = Mat::empty(in_stack_fffffffffffff650);
      if (bVar1) {
        local_4 = -100;
        local_a8 = 1;
      }
      else {
        Mat::fill(in_stack_fffffffffffff660,(float)((ulong)in_stack_fffffffffffff658 >> 0x20));
        for (local_254 = 0; local_254 < local_214; local_254 = local_254 + 1) {
          Mat::channel(in_stack_fffffffffffff658,(int)((ulong)in_stack_fffffffffffff650 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_298);
          Mat::~Mat((Mat *)0x13252b);
          local_260 = pfVar2;
          for (local_29c = 0; local_29c < local_218; local_29c = local_29c + 1) {
            pfVar2 = Mat::operator[](&local_250,local_29c);
            pfVar2 = std::max<float>(pfVar2,local_260 + local_29c);
            fVar4 = *pfVar2;
            pfVar2 = Mat::operator[](&local_250,local_29c);
            *pfVar2 = fVar4;
          }
        }
        for (local_2a0 = 0; local_2a0 < local_214; local_2a0 = local_2a0 + 1) {
          Mat::channel(in_stack_fffffffffffff658,(int)((ulong)in_stack_fffffffffffff650 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_2e0);
          Mat::~Mat((Mat *)0x1326a0);
          local_2a8 = pfVar2;
          for (local_2e4 = 0; local_2e4 < local_218; local_2e4 = local_2e4 + 1) {
            fVar4 = local_2a8[local_2e4];
            pfVar2 = Mat::operator[](&local_250,local_2e4);
            dVar3 = std::exp((double)(ulong)(uint)(fVar4 - *pfVar2));
            local_2a8[local_2e4] = SUB84(dVar3,0);
          }
        }
        Mat::Mat(&local_320);
        Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
                    (int)((ulong)in_stack_fffffffffffff668 >> 0x20),(int)in_stack_fffffffffffff668,
                    (size_t)in_stack_fffffffffffff660,(Allocator *)in_stack_fffffffffffff658);
        bVar1 = Mat::empty(in_stack_fffffffffffff650);
        if (bVar1) {
          local_4 = -100;
        }
        else {
          Mat::fill(in_stack_fffffffffffff660,(float)((ulong)in_stack_fffffffffffff658 >> 0x20));
          for (local_324 = 0; local_324 < local_214; local_324 = local_324 + 1) {
            Mat::channel(in_stack_fffffffffffff658,(int)((ulong)in_stack_fffffffffffff650 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(&local_368);
            Mat::~Mat((Mat *)0x1328ab);
            local_330 = pfVar2;
            for (local_36c = 0; local_36c < local_218; local_36c = local_36c + 1) {
              fVar4 = local_330[local_36c];
              pfVar2 = Mat::operator[](&local_320,local_36c);
              *pfVar2 = fVar4 + *pfVar2;
            }
          }
          for (local_370 = 0; local_370 < local_214; local_370 = local_370 + 1) {
            Mat::channel(in_stack_fffffffffffff658,(int)((ulong)in_stack_fffffffffffff650 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(&local_3b0);
            Mat::~Mat((Mat *)0x1329dc);
            local_378 = pfVar2;
            for (local_3b4 = 0; local_3b4 < local_218; local_3b4 = local_3b4 + 1) {
              pfVar2 = Mat::operator[](&local_320,local_3b4);
              local_378[local_3b4] = local_378[local_3b4] / *pfVar2;
            }
          }
          local_4 = 0;
        }
        local_a8 = 1;
        Mat::~Mat((Mat *)0x132ac0);
      }
      Mat::~Mat((Mat *)0x132ade);
    }
    else if ((local_24 == 3) && (*(int *)(in_RDI + 0x80) == 1)) {
      local_3b8 = in_RSI->w;
      local_3bc = in_RSI->h;
      local_3c0 = in_RSI->c;
      Mat::Mat(&local_3f8);
      Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
                  (int)((ulong)in_stack_fffffffffffff668 >> 0x20),(int)in_stack_fffffffffffff668,
                  (size_t)in_stack_fffffffffffff660,(Allocator *)in_stack_fffffffffffff658);
      bVar1 = Mat::empty(in_stack_fffffffffffff650);
      if (bVar1) {
        local_4 = -100;
        local_a8 = 1;
      }
      else {
        Mat::fill(in_stack_fffffffffffff660,(float)((ulong)in_stack_fffffffffffff658 >> 0x20));
        for (local_3fc = 0; local_3fc < local_3c0; local_3fc = local_3fc + 1) {
          Mat::channel(in_stack_fffffffffffff658,(int)((ulong)in_stack_fffffffffffff650 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_440);
          Mat::~Mat((Mat *)0x132c63);
          local_408 = pfVar2;
          local_448 = Mat::row(&local_3f8,local_3fc);
          for (local_44c = 0; local_44c < local_3bc; local_44c = local_44c + 1) {
            local_450 = -3.4028235e+38;
            for (local_454 = 0; local_454 < local_3b8; local_454 = local_454 + 1) {
              pfVar2 = std::max<float>(&local_450,local_408 + local_454);
              local_450 = *pfVar2;
            }
            local_448[local_44c] = local_450;
            local_408 = local_408 + local_3b8;
          }
        }
        for (local_458 = 0; local_458 < local_3c0; local_458 = local_458 + 1) {
          Mat::channel(in_stack_fffffffffffff658,(int)((ulong)in_stack_fffffffffffff650 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_498);
          Mat::~Mat((Mat *)0x132e33);
          local_460 = pfVar2;
          local_4a0 = Mat::row(&local_3f8,local_458);
          for (local_4a4 = 0; local_4a4 < local_3bc; local_4a4 = local_4a4 + 1) {
            local_4a8 = local_4a0[local_4a4];
            for (local_4ac = 0; local_4ac < local_3b8; local_4ac = local_4ac + 1) {
              dVar3 = std::exp((double)(ulong)(uint)(local_460[local_4ac] - local_4a8));
              local_460[local_4ac] = SUB84(dVar3,0);
            }
            local_460 = local_460 + local_3b8;
          }
        }
        Mat::Mat(&local_4e8);
        Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
                    (int)((ulong)in_stack_fffffffffffff668 >> 0x20),(int)in_stack_fffffffffffff668,
                    (size_t)in_stack_fffffffffffff660,(Allocator *)in_stack_fffffffffffff658);
        bVar1 = Mat::empty(in_stack_fffffffffffff650);
        if (bVar1) {
          local_4 = -100;
        }
        else {
          Mat::fill(in_stack_fffffffffffff660,(float)((ulong)in_stack_fffffffffffff658 >> 0x20));
          for (local_4ec = 0; local_4ec < local_3c0; local_4ec = local_4ec + 1) {
            Mat::channel(in_stack_fffffffffffff658,(int)((ulong)in_stack_fffffffffffff650 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(&local_530);
            Mat::~Mat((Mat *)0x1330af);
            local_4f8 = pfVar2;
            local_538 = Mat::row(&local_4e8,local_4ec);
            for (local_53c = 0; local_53c < local_3bc; local_53c = local_53c + 1) {
              local_540 = 0.0;
              for (local_544 = 0; local_544 < local_3b8; local_544 = local_544 + 1) {
                local_540 = local_4f8[local_544] + local_540;
              }
              local_538[local_53c] = local_540;
              local_4f8 = local_4f8 + local_3b8;
            }
          }
          for (local_548 = 0; local_548 < local_3c0; local_548 = local_548 + 1) {
            Mat::channel(in_stack_fffffffffffff658,(int)((ulong)in_stack_fffffffffffff650 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(&local_588);
            Mat::~Mat((Mat *)0x133258);
            local_550 = pfVar2;
            local_590 = Mat::row(&local_4e8,local_548);
            for (local_594 = 0; local_594 < local_3bc; local_594 = local_594 + 1) {
              local_598 = local_590[local_594];
              for (local_59c = 0; local_59c < local_3b8; local_59c = local_59c + 1) {
                local_550[local_59c] = local_550[local_59c] / local_598;
              }
              local_550 = local_550 + local_3b8;
            }
          }
          local_4 = 0;
        }
        local_a8 = 1;
        Mat::~Mat((Mat *)0x1333b4);
      }
      Mat::~Mat((Mat *)0x1333d2);
    }
    else if ((local_24 == 3) && (*(int *)(in_RDI + 0x80) == 2)) {
      local_5a0 = in_RSI->w;
      local_5a4 = in_RSI->h;
      local_5a8 = in_RSI->c;
      Mat::Mat(&local_5e0);
      Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
                  (int)((ulong)in_stack_fffffffffffff668 >> 0x20),(int)in_stack_fffffffffffff668,
                  (size_t)in_stack_fffffffffffff660,(Allocator *)in_stack_fffffffffffff658);
      bVar1 = Mat::empty(in_stack_fffffffffffff650);
      if (bVar1) {
        local_4 = -100;
        local_a8 = 1;
      }
      else {
        Mat::fill(in_stack_fffffffffffff660,(float)((ulong)in_stack_fffffffffffff658 >> 0x20));
        for (local_5e4 = 0; local_5e4 < local_5a8; local_5e4 = local_5e4 + 1) {
          Mat::channel(in_stack_fffffffffffff658,(int)((ulong)in_stack_fffffffffffff650 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_628);
          Mat::~Mat((Mat *)0x133548);
          local_5f0 = pfVar2;
          local_630 = Mat::row(&local_5e0,local_5e4);
          for (local_634 = 0; local_634 < local_5a4; local_634 = local_634 + 1) {
            for (local_638 = 0; local_638 < local_5a0; local_638 = local_638 + 1) {
              pfVar2 = std::max<float>(local_630 + local_638,local_5f0 + local_638);
              local_630[local_638] = *pfVar2;
            }
            local_5f0 = local_5f0 + local_5a0;
          }
        }
        for (local_63c = 0; local_63c < local_5a8; local_63c = local_63c + 1) {
          Mat::channel(in_stack_fffffffffffff658,(int)((ulong)in_stack_fffffffffffff650 >> 0x20));
          pfVar2 = Mat::operator_cast_to_float_(&local_680);
          Mat::~Mat((Mat *)0x1336eb);
          local_648 = pfVar2;
          local_688 = Mat::row(&local_5e0,local_63c);
          for (local_68c = 0; local_68c < local_5a4; local_68c = local_68c + 1) {
            for (local_690 = 0; local_690 < local_5a0; local_690 = local_690 + 1) {
              dVar3 = std::exp((double)(ulong)(uint)(local_648[local_690] - local_688[local_690]));
              in_stack_fffffffffffff674 = SUB84(dVar3,0);
              local_648[local_690] = in_stack_fffffffffffff674;
            }
            local_648 = local_648 + local_5a0;
          }
        }
        Mat::Mat(&local_6c8);
        Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff674,in_stack_fffffffffffff670),
                    (int)((ulong)in_stack_fffffffffffff668 >> 0x20),(int)in_stack_fffffffffffff668,
                    (size_t)in_stack_fffffffffffff660,(Allocator *)in_stack_fffffffffffff658);
        bVar1 = Mat::empty(in_stack_fffffffffffff650);
        if (bVar1) {
          local_4 = -100;
        }
        else {
          Mat::fill(in_stack_fffffffffffff660,(float)((ulong)in_stack_fffffffffffff658 >> 0x20));
          for (local_6cc = 0; local_6cc < local_5a8; local_6cc = local_6cc + 1) {
            Mat::channel(in_stack_fffffffffffff658,(int)((ulong)in_stack_fffffffffffff650 >> 0x20));
            pfVar2 = Mat::operator_cast_to_float_(&local_710);
            Mat::~Mat((Mat *)0x133935);
            local_6d8 = pfVar2;
            local_718 = Mat::row(&local_6c8,local_6cc);
            for (local_71c = 0; local_71c < local_5a4; local_71c = local_71c + 1) {
              for (local_720 = 0; local_720 < local_5a0; local_720 = local_720 + 1) {
                local_718[local_720] = local_6d8[local_720] + local_718[local_720];
              }
              local_6d8 = local_6d8 + local_5a0;
            }
          }
          for (local_724 = 0; local_724 < local_5a8; local_724 = local_724 + 1) {
            Mat::channel(in_stack_fffffffffffff658,(int)((ulong)in_stack_fffffffffffff650 >> 0x20));
            in_stack_fffffffffffff658 = (Mat *)Mat::operator_cast_to_float_(&local_768);
            Mat::~Mat((Mat *)0x133ab9);
            local_730 = in_stack_fffffffffffff658;
            in_stack_fffffffffffff650 = (Mat *)Mat::row(&local_6c8,local_724);
            for (local_774 = 0; local_774 < local_5a4; local_774 = local_774 + 1) {
              for (local_778 = 0; local_778 < local_5a0; local_778 = local_778 + 1) {
                *(float *)((long)&local_730->data + (long)local_778 * 4) =
                     *(float *)((long)&local_730->data + (long)local_778 * 4) /
                     *(float *)((long)&in_stack_fffffffffffff650->data + (long)local_778 * 4);
              }
              local_730 = (Mat *)((long)&local_730->data + (long)local_5a0 * 4);
            }
          }
          local_4 = 0;
        }
        local_a8 = 1;
        Mat::~Mat((Mat *)0x133c03);
      }
      Mat::~Mat((Mat *)0x133c21);
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int Softmax::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    // value = exp( value - global max value )
    // sum all value
    // value = value / sum

    int dims = bottom_top_blob.dims;
    size_t elemsize = bottom_top_blob.elemsize;

    if (dims == 1) // axis == 0
    {
        int w = bottom_top_blob.w;

        float* ptr = bottom_top_blob;

        float max = -FLT_MAX;
        for (int i=0; i<w; i++)
        {
            max = std::max(max, ptr[i]);
        }

        for (int i=0; i<w; i++)
        {
            ptr[i] = exp(ptr[i] - max);
        }

        float sum = 0.f;
        for (int i=0; i<w; i++)
        {
            sum += ptr[i];
        }

        for (int i=0; i<w; i++)
        {
            ptr[i] /= sum;
        }

        return 0;
    }

    if (dims == 2 && axis == 0)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;

        Mat max;
        max.create(w, elemsize, opt.workspace_allocator);
        if (max.empty())
            return -100;
        max.fill(-FLT_MAX);

        for (int i=0; i<h; i++)
        {
            const float* ptr = bottom_top_blob.row(i);
            for (int j=0; j<w; j++)
            {
                max[j] = std::max(max[j], ptr[j]);
            }
        }

        for (int i=0; i<h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            for (int j=0; j<w; j++)
            {
                ptr[j] = exp(ptr[j] - max[j]);
            }
        }

        Mat sum;
        sum.create(w, elemsize, opt.workspace_allocator);
        if (sum.empty())
            return -100;
        sum.fill(0.f);

        for (int i=0; i<h; i++)
        {
            const float* ptr = bottom_top_blob.row(i);
            for (int j=0; j<w; j++)
            {
                sum[j] += ptr[j];
            }
        }

        for (int i=0; i<h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            for (int j=0; j<w; j++)
            {
                ptr[j] /= sum[j];
            }
        }

        return 0;
    }

    if (dims == 2 && axis == 1)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;

        Mat max;
        max.create(h, elemsize, opt.workspace_allocator);
        if (max.empty())
            return -100;

        for (int i=0; i<h; i++)
        {
            const float* ptr = bottom_top_blob.row(i);

            float m = -FLT_MAX;
            for (int j=0; j<w; j++)
            {
                m = std::max(m, ptr[j]);
            }

            max[i] = m;
        }

        for (int i=0; i<h; i++)
        {
            float* ptr = bottom_top_blob.row(i);

            float m = max[i];
            for (int j=0; j<w; j++)
            {
                ptr[j] = exp(ptr[j] - m);
            }
        }

        Mat sum;
        sum.create(h, elemsize, opt.workspace_allocator);
        if (sum.empty())
            return -100;

        for (int i=0; i<h; i++)
        {
            const float* ptr = bottom_top_blob.row(i);

            float s = 0.f;
            for (int j=0; j<w; j++)
            {
                s += ptr[j];
            }

            sum[i] = s;
        }

        for (int i=0; i<h; i++)
        {
            float* ptr = bottom_top_blob.row(i);

            float s = sum[i];
            for (int j=0; j<w; j++)
            {
                ptr[j] /= s;
            }
        }

        return 0;
    }

    if (dims == 3 && axis == 0)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        Mat max;
        max.create(w, h, elemsize, opt.workspace_allocator);
        if (max.empty())
            return -100;
        max.fill(-FLT_MAX);
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                max[i] = std::max(max[i], ptr[i]);
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                ptr[i] = exp(ptr[i] - max[i]);
            }
        }

        Mat sum;
        sum.create(w, h, elemsize, opt.workspace_allocator);
        if (sum.empty())
            return -100;
        sum.fill(0.f);
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                sum[i] += ptr[i];
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                ptr[i] /= sum[i];
            }
        }

        return 0;
    }

    if (dims == 3 && axis == 1)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;

        Mat max;
        max.create(h, channels, elemsize, opt.workspace_allocator);
        if (max.empty())
            return -100;
        max.fill(-FLT_MAX);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_top_blob.channel(q);
            float* maxptr = max.row(q);

            for (int i=0; i<h; i++)
            {
                float max = -FLT_MAX;
                for (int j=0; j<w; j++)
                {
                    max = std::max(max, ptr[j]);
                }

                maxptr[i] = max;
                ptr += w;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float* maxptr = max.row(q);

            for (int i=0; i<h; i++)
            {
                float max = maxptr[i];
                for (int j=0; j<w; j++)
                {
                    ptr[j] = exp(ptr[j] - max);
                }

                ptr += w;
            }
        }

        Mat sum;
        sum.create(h, channels, elemsize, opt.workspace_allocator);
        if (sum.empty())
            return -100;
        sum.fill(0.f);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_top_blob.channel(q);
            float* sumptr = sum.row(q);

            for (int i=0; i<h; i++)
            {
                float sum = 0.f;
                for (int j=0; j<w; j++)
                {
                    sum += ptr[j];
                }

                sumptr[i] = sum;
                ptr += w;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float* sumptr = sum.row(q);

            for (int i=0; i<h; i++)
            {
                float sum = sumptr[i];
                for (int j=0; j<w; j++)
                {
                    ptr[j] /= sum;
                }

                ptr += w;
            }
        }

        return 0;
    }

    if (dims == 3 && axis == 2)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;

        Mat max;
        max.create(w, channels, elemsize, opt.workspace_allocator);
        if (max.empty())
            return -100;
        max.fill(-FLT_MAX);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_top_blob.channel(q);
            float* maxptr = max.row(q);

            for (int i=0; i<h; i++)
            {
                for (int j=0; j<w; j++)
                {
                    maxptr[j] = std::max(maxptr[j], ptr[j]);
                }

                ptr += w;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float* maxptr = max.row(q);

            for (int i=0; i<h; i++)
            {
                for (int j=0; j<w; j++)
                {
                    ptr[j] = exp(ptr[j] - maxptr[j]);
                }

                ptr += w;
            }
        }

        Mat sum;
        sum.create(w, channels, elemsize, opt.workspace_allocator);
        if (sum.empty())
            return -100;
        sum.fill(0.f);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_top_blob.channel(q);
            float* sumptr = sum.row(q);

            for (int i=0; i<h; i++)
            {
                for (int j=0; j<w; j++)
                {
                    sumptr[j] += ptr[j];
                }

                ptr += w;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float* sumptr = sum.row(q);

            for (int i=0; i<h; i++)
            {
                for (int j=0; j<w; j++)
                {
                    ptr[j] /= sumptr[j];
                }

                ptr += w;
            }
        }

        return 0;
    }

    return 0;
}